

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O2

void * rw::matfxOpen(void *o,int32 param_2,int32 param_3)

{
  ObjPipeline *pOVar1;
  long lVar2;
  
  pOVar1 = ObjPipeline::create();
  DAT_00146288 = pOVar1;
  (pOVar1->super_Pipeline).pluginID = 0;
  (pOVar1->super_Pipeline).pluginData = 0;
  for (lVar2 = 1; lVar2 != 0xe; lVar2 = lVar2 + 1) {
    *(ObjPipeline **)(&matFXGlobals + lVar2 * 2) = pOVar1;
  }
  return o;
}

Assistant:

static void*
matfxOpen(void *o, int32, int32)
{
	// init dummy pipelines
	matFXGlobals.dummypipe = ObjPipeline::create();
	matFXGlobals.dummypipe->pluginID = 0; //ID_MATFX;
	matFXGlobals.dummypipe->pluginData = 0;
	for(uint i = 0; i < nelem(matFXGlobals.pipelines); i++)
		matFXGlobals.pipelines[i] = matFXGlobals.dummypipe;
	return o;
}